

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O1

void __thiscall asmjit::v1_14::FuncArgsContext::FuncArgsContext(FuncArgsContext *this)

{
  uint8_t *puVar1;
  long lVar2;
  
  this->_archTraits = (ArchTraits *)0x0;
  this->_constraints = (RAConstraints *)0x0;
  *(undefined8 *)((long)&this->_constraints + 5) = 0;
  this->_saVarId = 0xff;
  this->_varCount = 0;
  lVar2 = 0;
  do {
    puVar1 = (this->_workData)._data[0]._reserved + lVar2 + -0xb;
    *(undefined8 *)puVar1 = 0;
    puVar1[8] = '\0';
    puVar1[9] = '\0';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\0';
    puVar1[0xe] = '\0';
    puVar1[0xf] = '\0';
    puVar1 = (this->_workData)._data[0]._reserved + lVar2 + -0x1b;
    *(undefined8 *)puVar1 = 0;
    puVar1[8] = '\0';
    puVar1[9] = '\0';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\0';
    puVar1[0xe] = '\0';
    puVar1[0xf] = '\0';
    puVar1 = (this->_workData)._data[0]._physToVarId + lVar2;
    puVar1[0] = 0xff;
    puVar1[1] = 0xff;
    puVar1[2] = 0xff;
    puVar1[3] = 0xff;
    puVar1[4] = 0xff;
    puVar1[5] = 0xff;
    puVar1[6] = 0xff;
    puVar1[7] = 0xff;
    puVar1[8] = 0xff;
    puVar1[9] = 0xff;
    puVar1[10] = 0xff;
    puVar1[0xb] = 0xff;
    puVar1[0xc] = 0xff;
    puVar1[0xd] = 0xff;
    puVar1[0xe] = 0xff;
    puVar1[0xf] = 0xff;
    puVar1 = (this->_workData)._data[0]._physToVarId + lVar2 + 0x10;
    puVar1[0] = 0xff;
    puVar1[1] = 0xff;
    puVar1[2] = 0xff;
    puVar1[3] = 0xff;
    puVar1[4] = 0xff;
    puVar1[5] = 0xff;
    puVar1[6] = 0xff;
    puVar1[7] = 0xff;
    puVar1[8] = 0xff;
    puVar1[9] = 0xff;
    puVar1[10] = 0xff;
    puVar1[0xb] = 0xff;
    puVar1[0xc] = 0xff;
    puVar1[0xd] = 0xff;
    puVar1[0xe] = 0xff;
    puVar1[0xf] = 0xff;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

ASMJIT_BEGIN_NAMESPACE

//! \cond INTERNAL
//! \addtogroup asmjit_core
//! \{

static inline OperandSignature getSuitableRegForMemToMemMove(Arch arch, TypeId dstTypeId, TypeId srcTypeId) noexcept {
  const ArchTraits& archTraits = ArchTraits::byArch(arch);

  uint32_t dstSize = TypeUtils::sizeOf(dstTypeId);
  uint32_t srcSize = TypeUtils::sizeOf(srcTypeId);
  uint32_t maxSize = Support::max<uint32_t>(dstSize, srcSize);
  uint32_t regSize = Environment::registerSizeFromArch(arch);

  OperandSignature signature{0};
  if (maxSize <= regSize || (TypeUtils::isInt(dstTypeId) && TypeUtils::isInt(srcTypeId)))
    signature = maxSize <= 4 ? archTraits.regTypeToSignature(RegType::kGp32)
                             : archTraits.regTypeToSignature(RegType::kGp64);
  else if (maxSize <= 8 && archTraits.hasRegType(RegType::kVec64))
    signature = archTraits.regTypeToSignature(RegType::kVec64);
  else if (maxSize <= 16 && archTraits.hasRegType(RegType::kVec128))
    signature = archTraits.regTypeToSignature(RegType::kVec128);
  else if (maxSize <= 32 && archTraits.hasRegType(RegType::kVec256))
    signature = archTraits.regTypeToSignature(RegType::kVec256);
  else if (maxSize <= 64 && archTraits.hasRegType(RegType::kVec512))
    signature = archTraits.regTypeToSignature(RegType::kVec512);

  return signature;
}